

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-error.c
# Opt level: O1

int run_test_pipe_connect_to_file(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  uv_loop_t *puVar2;
  int iVar3;
  uv_pipe_t *handle;
  uv_connect_t req;
  uv_pipe_t client;
  uv_connect_t local_170;
  uv_pipe_t local_110;
  
  puVar2 = uv_default_loop();
  handle = &local_110;
  iVar1 = uv_pipe_init(puVar2,handle,0);
  iVar3 = (int)handle;
  if (iVar1 == 0) {
    uv_pipe_connect(&local_170,&local_110,"test/fixtures/empty_file",connect_cb_file);
    puVar2 = uv_default_loop();
    iVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    if (close_cb_called != 1) goto LAB_00162af6;
    if (connect_cb_called == 1) {
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      iVar3 = 0;
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00162b00;
    }
  }
  else {
    run_test_pipe_connect_to_file_cold_1();
LAB_00162af6:
    run_test_pipe_connect_to_file_cold_2();
  }
  run_test_pipe_connect_to_file_cold_3();
LAB_00162b00:
  run_test_pipe_connect_to_file_cold_4();
  if ((iVar3 == -0x6f) || (iVar3 == -0x58)) {
    uv_close((uv_handle_t *)puVar2->pending_queue[0],close_cb);
    connect_cb_called = connect_cb_called + 1;
    return extraout_EAX;
  }
  connect_cb_file_cold_1();
  if (puVar2 != (uv_loop_t *)0x0) {
    close_cb_called = close_cb_called + 1;
    return extraout_EAX_00;
  }
  close_cb_cold_1();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX_01;
}

Assistant:

TEST_IMPL(pipe_connect_to_file) {
  const char* path = "test/fixtures/empty_file";
  uv_pipe_t client;
  uv_connect_t req;
  int r;

  r = uv_pipe_init(uv_default_loop(), &client, 0);
  ASSERT(r == 0);
  uv_pipe_connect(&req, &client, path, connect_cb_file);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(close_cb_called == 1);
  ASSERT(connect_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}